

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

tommy_tree_node *
tommy_tree_remove_node(undefined1 *cmp,tommy_tree_node *root,void *data,tommy_tree_node **let)

{
  long lVar1;
  int iVar2;
  tommy_tree_node *ptVar3;
  long in_FS_OFFSET;
  int c;
  tommy_tree_node **let_local;
  void *data_local;
  tommy_tree_node *root_local;
  undefined1 *cmp_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (root == (tommy_tree_node *)0x0) {
    cmp_local = (undefined1 *)0x0;
  }
  else {
    iVar2 = (*(code *)cmp)(data,root->data);
    if (iVar2 < 0) {
      ptVar3 = tommy_tree_remove_node(cmp,root->prev,data,let);
      root->prev = ptVar3;
      cmp_local = (undefined1 *)tommy_tree_balance(root);
    }
    else if (iVar2 < 1) {
      *let = root;
      cmp_local = (undefined1 *)tommy_tree_move_right(root->prev,root->next);
    }
    else {
      ptVar3 = tommy_tree_remove_node(cmp,root->next,data,let);
      root->next = ptVar3;
      cmp_local = (undefined1 *)tommy_tree_balance(root);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (tommy_tree_node *)cmp_local;
  }
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_remove_node(tommy_compare_func* cmp, tommy_tree_node* root, void* data, tommy_tree_node** let)
{
	int c;

	if (!root)
		return 0;

	c = cmp(data, root->data);

	if (c < 0) {
		root->prev = tommy_tree_remove_node(cmp, root->prev, data, let);
		return tommy_tree_balance(root);
	}

	if (c > 0) {
		root->next = tommy_tree_remove_node(cmp, root->next, data, let);
		return tommy_tree_balance(root);
	}

	/* found */
	*let = root;

	return tommy_tree_move_right(root->prev, root->next);
}